

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

int normal_scanPi(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  undefined8 in_RAX;
  char *pcVar5;
  ATTRIBUTE *pAVar6;
  char **ppcVar7;
  byte *pbVar8;
  uint uVar9;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  undefined8 extraout_RDX_08;
  long lVar11;
  byte *ptr_00;
  int tok;
  undefined8 uStack_38;
  uint uVar10;
  
  pAVar6 = (ATTRIBUTE *)(end + -(long)ptr);
  if ((long)pAVar6 < 1) {
    return -1;
  }
  bVar1 = *(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
  uStack_38 = in_RAX;
  if (bVar1 < 0x16) {
    if (bVar1 == 5) {
      if (pAVar6 == (ATTRIBUTE *)&DAT_00000001) {
        return -2;
      }
      iVar4 = (*enc[3].nameLength)(enc,ptr);
      if (iVar4 != 0) goto LAB_0075d644;
      iVar4 = (*enc[3].literalScanners[0])(enc,ptr,extraout_RDX_00,&pAVar6->name);
      lVar11 = 2;
    }
    else if (bVar1 == 6) {
      if ((long)pAVar6 < 3) {
        return -2;
      }
      pcVar5 = (*enc[3].skipS)(enc,ptr);
      if ((int)pcVar5 != 0) goto LAB_0075d644;
      iVar4 = (*enc[3].literalScanners[1])(enc,ptr,extraout_RDX_01,&pAVar6->name);
      lVar11 = 3;
    }
    else {
      if (bVar1 != 7) goto LAB_0075d644;
      if ((long)pAVar6 < 4) {
        return -2;
      }
      iVar4 = (*enc[3].getAtts)(enc,ptr,(int)end,pAVar6);
      if (iVar4 != 0) goto LAB_0075d644;
      iVar4 = (*enc[3].nameMatchesAscii)(enc,ptr,extraout_RDX,(char *)pAVar6);
      lVar11 = 4;
    }
    if (iVar4 == 0) {
LAB_0075d644:
      *nextTokPtr = ptr;
      return 0;
    }
  }
  else {
    lVar11 = 1;
    if ((bVar1 != 0x16) && (bVar1 != 0x18)) goto LAB_0075d644;
  }
  ptr_00 = (byte *)(ptr + lVar11);
  uVar3 = uStack_38;
  do {
    lVar11 = (long)end - (long)ptr_00;
    if (lVar11 < 1) {
      return -1;
    }
    uStack_38._4_4_ = (int)((ulong)uVar3 >> 0x20);
    uVar10 = (uint)*(byte *)((long)enc[1].scanners + (ulong)*ptr_00);
    uVar9 = uVar10 - 5;
    if (0x18 < uVar9) {
switchD_0075d6fa_caseD_8:
      pbVar8 = ptr_00;
LAB_0075d8fb:
      *nextTokPtr = (char *)pbVar8;
      return 0;
    }
    ppcVar7 = (char **)&DAT_00000001;
    uStack_38 = uVar3;
    switch(uVar10) {
    case 5:
      if (lVar11 == 1) {
        return -2;
      }
      iVar4 = (*enc[3].nameLength)(enc,(char *)ptr_00);
      if (iVar4 != 0) goto switchD_0075d6fa_caseD_1d;
      iVar4 = (*enc[3].scanners[0])(enc,(char *)ptr_00,extraout_RDX_02,ppcVar7);
      ppcVar7 = (char **)0x2;
      break;
    case 6:
      if (lVar11 < 3) {
        return -2;
      }
      pcVar5 = (*enc[3].skipS)(enc,(char *)ptr_00);
      if ((int)pcVar5 != 0) goto switchD_0075d6fa_caseD_1d;
      iVar4 = (*enc[3].scanners[1])(enc,(char *)ptr_00,extraout_RDX_04,ppcVar7);
      ppcVar7 = (char **)0x3;
      break;
    case 7:
      if (lVar11 < 4) {
        return -2;
      }
      iVar4 = (*enc[3].getAtts)(enc,(char *)ptr_00,
                                (&switchD_0075d6fa::switchdataD_009a4b24)[uVar9] + 0x9a4b24,
                                (ATTRIBUTE *)&DAT_00000001);
      if (iVar4 != 0) goto switchD_0075d6fa_caseD_1d;
      iVar4 = (*enc[3].scanners[2])(enc,(char *)ptr_00,extraout_RDX_03,ppcVar7);
      ppcVar7 = (char **)0x4;
      break;
    default:
      goto switchD_0075d6fa_caseD_8;
    case 9:
    case 10:
    case 0x15:
      iVar4 = normal_checkPiTarget
                        ((ENCODING *)ptr,(char *)ptr_00,(char *)((long)&uStack_38 + 4),
                         (int *)&DAT_00000001);
      if (iVar4 == 0) goto switchD_0075d6fa_caseD_1d;
      pbVar8 = ptr_00 + 1;
      uVar3 = extraout_RDX_05;
      uVar2 = uStack_38;
      goto joined_r0x0075d7e5;
    case 0xf:
      iVar4 = normal_checkPiTarget
                        ((ENCODING *)ptr,(char *)ptr_00,(char *)((long)&uStack_38 + 4),
                         (int *)&DAT_00000001);
      if (iVar4 == 0) goto switchD_0075d6fa_caseD_1d;
      pbVar8 = ptr_00 + 1;
      if ((byte *)end == pbVar8 || (long)end - (long)pbVar8 < 0) {
        return -1;
      }
      if (*pbVar8 != 0x3e) goto LAB_0075d8fb;
      goto LAB_0075d8e0;
    case 0x16:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
      goto switchD_0075d6fa_caseD_16;
    case 0x1d:
      goto switchD_0075d6fa_caseD_1d;
    }
    uVar3 = uStack_38;
    if (iVar4 == 0) goto switchD_0075d6fa_caseD_1d;
switchD_0075d6fa_caseD_16:
    uStack_38 = uVar3;
    ptr_00 = ptr_00 + (long)ppcVar7;
    uVar3 = uStack_38;
  } while( true );
joined_r0x0075d7e5:
  ptr_00 = pbVar8;
  lVar11 = (long)end - (long)ptr_00;
  if (lVar11 < 1) {
    return -1;
  }
  uStack_38._4_4_ = (int)((ulong)uVar2 >> 0x20);
  bVar1 = *(byte *)((long)enc[1].scanners + (ulong)*ptr_00);
  if (0xf < (ulong)bVar1) {
switchD_0075d80a_caseD_2:
    pbVar8 = ptr_00 + 1;
    goto joined_r0x0075d7e5;
  }
  uStack_38 = uVar2;
  switch(bVar1) {
  case 0:
  case 1:
  case 8:
switchD_0075d6fa_caseD_1d:
    *nextTokPtr = (char *)ptr_00;
    return 0;
  default:
    goto switchD_0075d80a_caseD_2;
  case 5:
    if (lVar11 == 1) {
      return -2;
    }
    iVar4 = (*enc[3].nameLength)(enc,(char *)ptr_00);
    if (iVar4 != 0) goto switchD_0075d6fa_caseD_1d;
    pbVar8 = ptr_00 + 2;
    uVar3 = extraout_RDX_06;
    uVar2 = uStack_38;
    break;
  case 6:
    if (lVar11 < 3) {
      return -2;
    }
    pcVar5 = (*enc[3].skipS)(enc,(char *)ptr_00);
    if ((int)pcVar5 != 0) goto switchD_0075d6fa_caseD_1d;
    pbVar8 = ptr_00 + 3;
    uVar3 = extraout_RDX_07;
    uVar2 = uStack_38;
    break;
  case 7:
    if (lVar11 < 4) {
      return -2;
    }
    iVar4 = (*enc[3].getAtts)(enc,(char *)ptr_00,(int)uVar3,
                              (ATTRIBUTE *)
                              ((long)&switchD_0075d80a::switchdataD_009a4b88 +
                              (long)(int)(&switchD_0075d80a::switchdataD_009a4b88)[bVar1]));
    if (iVar4 != 0) goto switchD_0075d6fa_caseD_1d;
    pbVar8 = ptr_00 + 4;
    uVar3 = extraout_RDX_08;
    uVar2 = uStack_38;
    break;
  case 0xf:
    pbVar8 = ptr_00 + 1;
    if ((byte *)end == pbVar8 || (long)end - (long)pbVar8 < 0) {
      return -1;
    }
    if (*pbVar8 == 0x3e) {
LAB_0075d8e0:
      *nextTokPtr = (char *)(ptr_00 + 2);
      return uStack_38._4_4_;
    }
  }
  goto joined_r0x0075d7e5;
}

Assistant:

static int PTRCALL
PREFIX(scanPi)(const ENCODING *enc, const char *ptr, const char *end,
               const char **nextTokPtr) {
  int tok;
  const char *target = ptr;
  REQUIRE_CHAR(enc, ptr, end);
  switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
      CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_S:
    case BT_CR:
    case BT_LF:
      if (! PREFIX(checkPiTarget)(enc, target, ptr, &tok)) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      ptr += MINBPC(enc);
      while (HAS_CHAR(enc, ptr, end)) {
        switch (BYTE_TYPE(enc, ptr)) {
          INVALID_CASES(ptr, nextTokPtr)
        case BT_QUEST:
          ptr += MINBPC(enc);
          REQUIRE_CHAR(enc, ptr, end);
          if (CHAR_MATCHES(enc, ptr, ASCII_GT)) {
            *nextTokPtr = ptr + MINBPC(enc);
            return tok;
          }
          break;
        default:
          ptr += MINBPC(enc);
          break;
        }
      }
      return XML_TOK_PARTIAL;
    case BT_QUEST:
      if (! PREFIX(checkPiTarget)(enc, target, ptr, &tok)) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      ptr += MINBPC(enc);
      REQUIRE_CHAR(enc, ptr, end);
      if (CHAR_MATCHES(enc, ptr, ASCII_GT)) {
        *nextTokPtr = ptr + MINBPC(enc);
        return tok;
      }
      /* fall through */
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}